

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblob.cpp
# Opt level: O1

SQUserPointer sqstd_createblob(HSQUIRRELVM v,SQInteger size)

{
  bool bVar1;
  SQUserPointer in_RAX;
  SQInteger newtop;
  SQRESULT SVar2;
  SQUserPointer pvVar3;
  SQBlob *blob;
  SQUserPointer local_28;
  
  local_28 = in_RAX;
  newtop = sq_gettop(v);
  sq_pushregistrytable(v);
  sq_pushstring(v,"std_blob",-1);
  SVar2 = sq_get(v,-2);
  if (-1 < SVar2) {
    sq_remove(v,-2);
    sq_push(v,1);
    sq_pushinteger(v,size);
    local_28 = (SQUserPointer)0x0;
    pvVar3 = (SQUserPointer)sq_call(v,2,1,0);
    bVar1 = true;
    if ((-1 < (long)pvVar3) &&
       (pvVar3 = (SQUserPointer)sq_getinstanceup(v,-1,&local_28,&DAT_80000002), -1 < (long)pvVar3))
    {
      sq_remove(v,-2);
      pvVar3 = *(SQUserPointer *)((long)local_28 + 0x28);
      bVar1 = false;
    }
    if (!bVar1) {
      return pvVar3;
    }
  }
  sq_settop(v,newtop);
  return (SQUserPointer)0x0;
}

Assistant:

SQUserPointer sqstd_createblob(HSQUIRRELVM v, SQInteger size)
{
    SQInteger top = sq_gettop(v);
    sq_pushregistrytable(v);
    sq_pushstring(v,_SC("std_blob"),-1);
    if(SQ_SUCCEEDED(sq_get(v,-2))) {
        sq_remove(v,-2); //removes the registry
        sq_push(v,1); // push the this
        sq_pushinteger(v,size); //size
        SQBlob *blob = NULL;
        if(SQ_SUCCEEDED(sq_call(v,2,SQTrue,SQFalse))
            && SQ_SUCCEEDED(sq_getinstanceup(v,-1,(SQUserPointer *)&blob,(SQUserPointer)SQSTD_BLOB_TYPE_TAG))) {
            sq_remove(v,-2);
            return blob->GetBuf();
        }
    }
    sq_settop(v,top);
    return NULL;
}